

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

void __thiscall
FIX::SessionState::get
          (SessionState *this,int b,int e,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *m)

{
  Locker local_28;
  Locker l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *m_local;
  int e_local;
  int b_local;
  SessionState *this_local;
  
  l.m_mutex = (Mutex *)m;
  Locker::Locker(&local_28,&this->m_mutex);
  (*this->m_pStore->_vptr_MessageStore[3])(this->m_pStore,(ulong)(uint)b,(ulong)(uint)e,l.m_mutex);
  Locker::~Locker(&local_28);
  return;
}

Assistant:

void get( int b, int e, std::vector < std::string > &m ) const
  EXCEPT ( IOException )
  { Locker l( m_mutex ); m_pStore->get( b, e, m ); }